

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O1

QPDFObjectHandle __thiscall QPDFParser::parseRemainder(QPDFParser *this,bool content_stream)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  token_type_e tVar3;
  uint uVar4;
  Tokenizer *pTVar5;
  pointer pcVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long lVar8;
  pointer pSVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  element_type *peVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  qpdf_offset_t qVar17;
  longlong lVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  mapped_type *pmVar20;
  const_iterator cVar21;
  undefined7 extraout_var;
  undefined8 uVar22;
  size_t *psVar23;
  string *psVar24;
  logic_error *this_01;
  QPDFObject *__tmp;
  undefined4 in_EDX;
  QPDFParser *extraout_RDX;
  QPDFParser *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var25;
  QPDFParser *extraout_RDX_01;
  QPDFParser *extraout_RDX_02;
  QPDFParser *extraout_RDX_03;
  pointer pcVar26;
  ulong uVar27;
  undefined7 in_register_00000031;
  QPDFParser *this_02;
  StackFrame *pSVar28;
  QPDFObjectHandle QVar29;
  string s;
  shared_ptr<QPDFObject> object;
  undefined1 local_198 [8];
  undefined1 local_190 [24];
  _Base_ptr local_178;
  size_t local_170;
  QPDFObjectHandle local_168;
  QPDFParser *local_158;
  undefined4 local_14c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  uint local_13c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  undefined4 local_124;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *local_118;
  key_type local_110;
  key_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>> *local_c8;
  string local_c0;
  key_type local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_80;
  key_type local_78;
  key_type local_58;
  size_type local_38;
  
  this_02 = (QPDFParser *)CONCAT71(in_register_00000031,content_stream);
  this_02->bad_count = 0;
  local_c8 = (vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>> *)
             &this_02->stack;
  local_148 = &local_f0.field_2;
  local_138 = &local_110.field_2;
  local_130 = &local_c0.field_2;
  local_120 = &local_a0.field_2;
  local_d0 = &local_78.field_2;
  local_80 = &(this_02->description).
              super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
  local_158 = this;
  local_124 = in_EDX;
LAB_001debd1:
  local_13c = 0;
LAB_001debd9:
  pcVar26 = local_190 + 8;
  bVar14 = ::qpdf::Tokenizer::nextToken
                     (this_02->tokenizer,this_02->input,this_02->object_description,0);
  if (!bVar14) {
    pTVar5 = this_02->tokenizer;
    qVar17 = InputSource::getLastOffset(this_02->input);
    warn(this_02,qVar17,&pTVar5->error_message);
  }
  this_02->good_count = this_02->good_count + 1;
  iVar15 = this_02->int_count;
  if (iVar15 != 0) {
    tVar3 = this_02->tokenizer->type;
    if (tVar3 == tt_integer) {
      this_02->int_count = iVar15 + 1;
      if (1 < iVar15) {
        addInt(this_02,iVar15 + 1);
      }
      qVar17 = InputSource::getLastOffset(this_02->input);
      this_02->last_offset_buffer[this_02->int_count % 2] = qVar17;
      lVar18 = QUtil::string_to_ll((&this_02->tokenizer->val)
                                   [(this_02->tokenizer->type & ~tt_array_open) != tt_name].
                                   _M_dataplus._M_p);
      this_02->int_buffer[this_02->int_count % 2] = lVar18;
      goto LAB_001debd9;
    }
    if ((tVar3 == tt_word && 1 < iVar15) &&
       (iVar15 = std::__cxx11::string::compare((char *)&this_02->tokenizer->raw_val), iVar15 == 0))
    {
      if (this_02->context == (QPDF *)0x0) {
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_01,
                   "QPDFParser::parse called without context on an object with indirect references")
        ;
        __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      iVar15 = this_02->int_count + -1;
      iVar15 = iVar15 - ((this_02->int_count - (iVar15 >> 0x1f)) - 1U & 0xfffffffe);
      if (this_02->int_buffer[iVar15] - 0x80000000U < 0xffffffff00000000) {
        QIntC::IntConverter<long_long,_int,_true,_true>::error(this_02->int_buffer[iVar15]);
      }
      iVar15 = (int)this_02->int_buffer[iVar15];
      iVar16 = this_02->int_count % 2;
      if (this_02->int_buffer[iVar16] - 0x80000000U < 0xffffffff00000000) {
        QIntC::IntConverter<long_long,_int,_true,_true>::error(this_02->int_buffer[iVar16]);
      }
      if ((iVar15 < 1) || (uVar4 = (uint)this_02->int_buffer[iVar16], 0xfffe < uVar4)) {
        addNull(this_02);
      }
      else {
        QPDF::getObjectForParser((QPDF *)local_198,(int)this_02->context,iVar15,SUB41(uVar4,0));
        add(this_02,(shared_ptr<QPDFObject> *)local_198);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._0_8_);
        }
      }
      this_02->int_count = 0;
      goto LAB_001debd9;
    }
    iVar15 = this_02->int_count;
    if (0 < iVar15) {
      if (iVar15 != 1) {
        addInt(this_02,iVar15 + -1);
      }
      addInt(this_02,this_02->int_count);
      this_02->int_count = 0;
    }
  }
  pTVar5 = this_02->tokenizer;
  tVar3 = pTVar5->type;
  switch(tVar3) {
  case tt_bad:
    goto switchD_001ded21_caseD_0;
  case tt_array_close:
    if ((this_02->bad_count != 0) && (this_02->max_bad_count == 0)) {
LAB_001dfb8e:
      tooManyBadTokens(this_02);
      goto LAB_001dfc3c;
    }
    pSVar28 = this_02->frame;
    if (pSVar28->state != st_array) {
      local_198 = (undefined1  [8])pcVar26;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,"treating unexpected array close token as null","");
      qVar17 = InputSource::getLastOffset(this_02->input);
      warn(this_02,qVar17,(string *)local_198);
      goto LAB_001df4c6;
    }
    if (pSVar28->null_count < 0x65) {
      local_198 = (undefined1  [8])0x0;
      local_190._0_8_ =
           (pSVar28->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_190._8_8_ =
           (pSVar28->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_190._16_8_ =
           (pSVar28->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      (pSVar28->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pSVar28->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pSVar28->olist).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
      ((string *)
      local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi)->_M_string_length = 0x100000001;
      (((string *)
       local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_002eeae8;
      local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               &((string *)
                local_168.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                field_2;
      (((string *)
       local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->field_2)._M_allocated_capacity = (size_type)local_198;
      local_198 = (undefined1  [8])0x0;
      *(undefined8 *)
       ((long)&((string *)
               local_168.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               field_2 + 8) = local_190._0_8_;
      (((string *)
       ((long)local_168.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x20))
      ->_M_dataplus)._M_p = (pointer)local_190._8_8_;
      ((string *)
      ((long)local_168.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x20))->
      _M_string_length = local_190._16_8_;
      local_190._16_8_ = (_Base_ptr)0x0;
      local_190._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_190._8_8_ = (_Base_ptr)0x0;
      *(undefined1 *)
       &(((string *)
         ((long)local_168.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x40)
         )->_M_dataplus)._M_p = 8;
      ((string *)
      ((long)local_168.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x40))->
      _M_string_length = 0;
      (((string *)
       ((long)local_168.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x40))
      ->field_2)._M_allocated_capacity = 0;
      *(undefined8 *)
       ((long)&((string *)
               ((long)local_168.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
               0x40))->field_2 + 8) = 0;
      (((string *)
       ((long)local_168.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x60))
      ->_M_dataplus)._M_p = (pointer)0x0;
      ((string *)
      ((long)local_168.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x60))->
      _M_string_length = 0xffffffffffffffff;
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_190);
    }
    else {
      QPDF_Array::QPDF_Array((QPDF_Array *)local_198,&pSVar28->olist,true);
      local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
      ((string *)
      local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi)->_M_string_length = 0x100000001;
      (((string *)
       local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_002eeae8;
      local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               &((string *)
                local_168.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                field_2;
      (((string *)
       local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->field_2)._M_allocated_capacity = (size_type)local_198;
      local_198 = (undefined1  [8])0x0;
      *(undefined8 *)
       ((long)&((string *)
               local_168.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               field_2 + 8) = local_190._0_8_;
      (((string *)
       ((long)local_168.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x20))
      ->_M_dataplus)._M_p = (pointer)local_190._8_8_;
      ((string *)
      ((long)local_168.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x20))->
      _M_string_length = local_190._16_8_;
      local_190._16_8_ = (_Base_ptr)0x0;
      local_190._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_190._8_8_ = (_Base_ptr)0x0;
      *(undefined1 *)
       &(((string *)
         ((long)local_168.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x40)
         )->_M_dataplus)._M_p = 8;
      ((string *)
      ((long)local_168.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x40))->
      _M_string_length = 0;
      (((string *)
       ((long)local_168.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x40))
      ->field_2)._M_allocated_capacity = 0;
      *(undefined8 *)
       ((long)&((string *)
               ((long)local_168.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
               0x40))->field_2 + 8) = 0;
      (((string *)
       ((long)local_168.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x60))
      ->_M_dataplus)._M_p = (pointer)0x0;
      ((string *)
      ((long)local_168.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x60))->
      _M_string_length = 0xffffffffffffffff;
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_190);
    }
    std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::~unique_ptr
              ((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)local_198
              );
    peVar13 = local_168.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((InputSource *)
        local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (InputSource *)0x0) {
      lVar8 = this_02->frame->offset;
      *(QPDF **)((char *)((long)local_168.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                         0x10) + 0x38) = this_02->context;
      *(element_type **)
       ((char *)((long)local_168.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10) +
       0x28) = (this_02->description).
               super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((char *)((long)local_168.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                          0x10) + 0x30),local_80);
      if (*(long *)((char *)((long)peVar13 + 0x10) + 0x48) < 0) {
        *(long *)((char *)((long)peVar13 + 0x10) + 0x48) = lVar8 + -1;
      }
    }
    pSVar9 = (this_02->stack).
             super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar27 = ((long)pSVar9 -
              (long)(this_02->stack).
                    super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3;
    if (uVar27 < 2) goto LAB_001dfa9a;
    pSVar28 = pSVar9 + -1;
    (this_02->stack).
    super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar28;
    __gnu_cxx::new_allocator<QPDFParser::StackFrame>::destroy<QPDFParser::StackFrame>
              ((new_allocator<QPDFParser::StackFrame> *)local_c8,pSVar28);
    this_02->frame =
         (this_02->stack).
         super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>._M_impl
         .super__Vector_impl_data._M_finish + -1;
    add(this_02,(shared_ptr<QPDFObject> *)&local_168);
    _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    break;
  case tt_array_open:
  case tt_dict_open:
    goto switchD_001ded21_caseD_2;
  case tt_brace_close:
  case tt_brace_open:
    local_198 = (undefined1  [8])pcVar26;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"treating unexpected brace token as null","");
    qVar17 = InputSource::getLastOffset(this_02->input);
    warn(this_02,qVar17,(string *)local_198);
    goto LAB_001df4c6;
  case tt_dict_close:
    if ((this_02->bad_count != 0) && (this_02->max_bad_count == 0)) goto LAB_001dfb8e;
    pSVar28 = this_02->frame;
    if (1 < (int)pSVar28->state) {
      local_198 = (undefined1  [8])(local_190 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,"unexpected dictionary close token","");
      qVar17 = InputSource::getLastOffset(this_02->input);
      warn(this_02,qVar17,(string *)local_198);
      goto LAB_001df4c6;
    }
    this_00 = &pSVar28->dict;
    if (pSVar28->state == st_dictionary_value) {
      qVar17 = pSVar28->offset;
      local_198 = (undefined1  [8])(local_190 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,
                 "dictionary ended prematurely; using null as value for last key","");
      warn(this_02,qVar17,(string *)local_198);
      if (local_198 != (undefined1  [8])(local_190 + 8)) {
        operator_delete((void *)local_198,(ulong)(local_190._8_8_ + 1));
      }
      p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
      p_Var19->_M_use_count = 1;
      p_Var19->_M_weak_count = 1;
      p_Var19->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002eeae8;
      *(undefined1 *)&p_Var19[4]._vptr__Sp_counted_base = 2;
      p_Var19[4]._M_use_count = 0;
      p_Var19[4]._M_weak_count = 0;
      p_Var19[5]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var19[5]._M_use_count = 0;
      p_Var19[5]._M_weak_count = 0;
      p_Var19[6]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var19[6]._M_use_count = -1;
      p_Var19[6]._M_weak_count = -1;
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                ::operator[](this_00,&this_02->frame->key);
      (pmVar20->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(p_Var19 + 1);
      p_Var7 = (pmVar20->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (pmVar20->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var19;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
    }
    if ((this_02->frame->olist).
        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this_02->frame->olist).
        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      fixMissingKeys(this_02);
    }
    local_38 = (this_02->frame->contents_string)._M_string_length;
    local_118 = this_00;
    if (local_38 == 0) {
LAB_001df53e:
      bVar14 = false;
LAB_001df6a2:
      bVar12 = false;
LAB_001df6a7:
      bVar11 = false;
LAB_001df6a9:
      bVar10 = false;
      local_14c = 0;
    }
    else {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/Type","");
      cVar21 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
               ::find(&this_00->_M_t,&local_f0);
      p_Var1 = &(pSVar28->dict)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)cVar21._M_node == p_Var1) goto LAB_001df53e;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"/Type","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                ::operator[](this_00,&local_110);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"/Sig","");
      bVar14 = QPDFObjectHandle::isNameAndEquals(pmVar20,&local_c0);
      if (!bVar14) {
        bVar14 = true;
        goto LAB_001df6a2;
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/ByteRange","");
      cVar21 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
               ::find(&local_118->_M_t,&local_a0);
      if ((_Rb_tree_header *)cVar21._M_node == p_Var1) {
        bVar14 = true;
        bVar12 = true;
        goto LAB_001df6a7;
      }
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"/Contents","");
      cVar21 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
               ::find(&local_118->_M_t,&local_78);
      if ((_Rb_tree_header *)cVar21._M_node == p_Var1) {
        bVar14 = true;
        bVar12 = true;
        bVar11 = true;
        goto LAB_001df6a9;
      }
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"/Contents","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                ::operator[](local_118,&local_58);
      bVar14 = QPDFObjectHandle::isString(pmVar20);
      local_14c = (undefined4)CONCAT71(extraout_var,bVar14);
      bVar14 = true;
      bVar12 = true;
      bVar11 = true;
      bVar10 = true;
    }
    if ((bVar10) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2)) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((bVar11) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2)) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((bVar12) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2)) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (bVar14) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_38 != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2)) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((char)local_14c != '\0') {
      QPDFObjectHandle::newString(&local_168,&this_02->frame->contents_string);
      local_198 = (undefined1  [8])(local_190 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"/Contents","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                ::operator[](local_118,(key_type *)local_198);
      _Var25._M_pi = local_168.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      peVar13 = local_168.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var7 = (pmVar20->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (pmVar20->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar13;
      (pmVar20->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var25._M_pi;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      if (local_198 != (undefined1  [8])(local_190 + 8)) {
        operator_delete((void *)local_198,(ulong)(local_190._8_8_ + 1));
      }
      if ((string *)
          local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (string *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_168.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      local_198 = (undefined1  [8])(local_190 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"/Contents","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                ::operator[](local_118,(key_type *)local_198);
      QPDFObjectHandle::setParsedOffset(pmVar20,this_02->frame->contents_offset);
      if (local_198 != (undefined1  [8])(local_190 + 8)) {
        operator_delete((void *)local_198,(ulong)(local_190._8_8_ + 1));
      }
    }
    local_190._8_8_ = (pSVar28->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((_Base_ptr)local_190._8_8_ == (_Base_ptr)0x0) {
      local_190._0_8_ = (ulong)(uint)local_190._4_4_ << 0x20;
      local_190._8_8_ = (_Base_ptr)0x0;
      local_190._16_8_ = local_190;
      psVar23 = &local_170;
      local_178 = (_Base_ptr)local_190._16_8_;
    }
    else {
      p_Var1 = &(pSVar28->dict)._M_t._M_impl.super__Rb_tree_header;
      local_190._0_4_ = (pSVar28->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      local_190._16_8_ = (pSVar28->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_178 = (pSVar28->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      ((_Base_ptr)local_190._8_8_)->_M_parent = (_Base_ptr)local_190;
      psVar23 = &(pSVar28->dict)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_170 = (pSVar28->dict)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      (pSVar28->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pSVar28->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (pSVar28->dict)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    *psVar23 = 0;
    local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
    ((string *)
    local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi)->_M_string_length = 0x100000001;
    (((string *)
     local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_002eeae8;
    p_Var2 = (_Base_ptr)
             ((long)&((string *)
                     local_168.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     field_2 + 8);
    if ((_Base_ptr)local_190._8_8_ == (_Base_ptr)0x0) {
      *(undefined4 *)
       ((long)&((string *)
               local_168.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               field_2 + 8) = 0;
      (((string *)
       ((long)local_168.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x20))
      ->_M_dataplus)._M_p = (pointer)0x0;
      ((string *)
      ((long)local_168.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x20))->
      _M_string_length = (size_type)p_Var2;
      (((string *)
       ((long)local_168.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x20))
      ->field_2)._M_allocated_capacity = (size_type)p_Var2;
      psVar23 = (size_t *)
                ((long)&((string *)
                        ((long)local_168.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 0x20))->field_2 + 8);
    }
    else {
      *(undefined4 *)
       ((long)&((string *)
               local_168.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               field_2 + 8) = local_190._0_4_;
      (((string *)
       ((long)local_168.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x20))
      ->_M_dataplus)._M_p = (pointer)local_190._8_8_;
      ((string *)
      ((long)local_168.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x20))->
      _M_string_length = local_190._16_8_;
      (((string *)
       ((long)local_168.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x20))
      ->field_2)._M_allocated_capacity = (size_type)local_178;
      *(_Base_ptr *)(local_190._8_8_ + 8) = p_Var2;
      *(size_t *)
       ((long)&((string *)
               ((long)local_168.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
               0x20))->field_2 + 8) = local_170;
      local_190._8_8_ = (_Base_ptr)0x0;
      local_190._16_8_ = local_190;
      psVar23 = &local_170;
      local_178 = (_Base_ptr)local_190._16_8_;
    }
    *psVar23 = 0;
    *(undefined1 *)
     &(((string *)
       ((long)local_168.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x40))
      ->_M_dataplus)._M_p = 9;
    ((string *)
    ((long)local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi + 0x40))->_M_string_length = 0;
    (((string *)
     ((long)local_168.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x40))->
    field_2)._M_allocated_capacity = 0;
    *(undefined8 *)
     ((long)&((string *)
             ((long)local_168.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             0x40))->field_2 + 8) = 0;
    (((string *)
     ((long)local_168.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0x60))->
    _M_dataplus)._M_p = (pointer)0x0;
    ((string *)
    ((long)local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi + 0x60))->_M_string_length = 0xffffffffffffffff;
    local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)
           &((string *)
            local_168.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->field_2;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                 *)local_198);
    peVar13 = local_168.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((InputSource *)
        local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (InputSource *)0x0) {
      lVar8 = this_02->frame->offset;
      *(QPDF **)((char *)((long)local_168.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                         0x10) + 0x38) = this_02->context;
      *(element_type **)
       ((char *)((long)local_168.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10) +
       0x28) = (this_02->description).
               super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((char *)((long)local_168.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                          0x10) + 0x30),local_80);
      if (*(long *)((char *)((long)peVar13 + 0x10) + 0x48) < 0) {
        *(long *)((char *)((long)peVar13 + 0x10) + 0x48) = lVar8 + -2;
      }
    }
    pSVar9 = (this_02->stack).
             super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar27 = ((long)pSVar9 -
              (long)(this_02->stack).
                    super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3;
    if (uVar27 < 2) {
LAB_001dfa9a:
      _Var25._M_pi = local_168.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_158->input =
           (InputSource *)
           local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_158->object_description = (string *)0x0;
      local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_158->object_description = (string *)_Var25._M_pi;
      local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158;
    }
    else {
      pSVar28 = pSVar9 + -1;
      (this_02->stack).
      super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>._M_impl.
      super__Vector_impl_data._M_finish = pSVar28;
      __gnu_cxx::new_allocator<QPDFParser::StackFrame>::destroy<QPDFParser::StackFrame>
                ((new_allocator<QPDFParser::StackFrame> *)local_c8,pSVar28);
      this_02->frame =
           (this_02->stack).
           super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
      add(this_02,(shared_ptr<QPDFObject> *)&local_168);
      _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
    }
    break;
  case tt_integer:
    if ((char)local_124 == '\0') {
      qVar17 = InputSource::getLastOffset(this_02->input);
      this_02->last_offset_buffer[1] = qVar17;
      lVar18 = QUtil::string_to_ll((&this_02->tokenizer->val)
                                   [(this_02->tokenizer->type & ~tt_array_open) != tt_name].
                                   _M_dataplus._M_p);
      this_02->int_buffer[1] = lVar18;
      this_02->int_count = 1;
    }
    else {
      local_198 = (undefined1  [8])
                  QUtil::string_to_ll((&pTVar5->val)[(tVar3 & ~tt_array_open) != tt_name].
                                      _M_dataplus._M_p);
      addScalar<QPDF_Integer,long_long>(this_02,(longlong *)local_198);
    }
    goto LAB_001debd9;
  case tt_name:
    if (this_02->frame->state == st_dictionary_key) {
      std::__cxx11::string::_M_assign((string *)&this_02->frame->key);
      pSVar28 = this_02->frame;
      pSVar28->state = st_dictionary_value;
      local_13c = 0;
      if (this_02->decrypter != (StringDecrypter *)0x0) {
        uVar22 = std::__cxx11::string::compare((char *)&pSVar28->key);
        local_13c = (uint)CONCAT71((int7)((ulong)uVar22 >> 8),(int)uVar22 == 0);
      }
    }
    else {
      addScalar<QPDF_Name,std::__cxx11::string_const&>
                (this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &(&pTVar5->val)[(tVar3 & ~tt_array_open) != tt_name]._M_dataplus);
    }
    goto LAB_001debd9;
  case tt_real:
    addScalar<QPDF_Real,std::__cxx11::string_const&>(this_02,&pTVar5->raw_val);
    goto LAB_001debd9;
  case tt_string:
    if (this_02->decrypter == (StringDecrypter *)0x0) {
LAB_001df452:
      addScalar<QPDF_String,std::__cxx11::string_const&>(this_02,&pTVar5->val);
    }
    else {
      if ((local_13c & 1) != 0) {
        std::__cxx11::string::_M_assign((string *)&this_02->frame->contents_string);
        qVar17 = InputSource::getLastOffset(this_02->input);
        this_02->frame->contents_offset = qVar17;
        local_13c = 0;
      }
      pcVar6 = (pTVar5->val)._M_dataplus._M_p;
      local_198 = (undefined1  [8])pcVar26;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_198,pcVar6,pcVar6 + (pTVar5->val)._M_string_length);
      (*this_02->decrypter->_vptr_StringDecrypter[2])(this_02->decrypter,local_198);
      addScalar<QPDF_String,std::__cxx11::string&>
                (this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_198);
      if (local_198 != (undefined1  [8])pcVar26) {
        operator_delete((void *)local_198,(ulong)(local_190._8_8_ + 1));
      }
    }
    goto LAB_001debd9;
  case tt_null:
    goto switchD_001ded21_caseD_b;
  case tt_bool:
    iVar15 = std::__cxx11::string::compare((char *)&pTVar5->raw_val);
    local_198[0] = iVar15 == 0;
    addScalar<QPDF_Bool,bool>(this_02,(bool *)local_198);
    goto LAB_001debd9;
  case tt_word:
    if ((char)local_124 != '\0') goto code_r0x001df309;
    local_198 = (undefined1  [8])pcVar26;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"unknown token while reading object; treating as string","");
    qVar17 = InputSource::getLastOffset(this_02->input);
    warn(this_02,qVar17,(string *)local_198);
    if (local_198 != (undefined1  [8])pcVar26) {
      operator_delete((void *)local_198,(ulong)(local_190._8_8_ + 1));
    }
    bVar14 = tooManyBadTokens(this_02);
    if (!bVar14) {
      pTVar5 = (Tokenizer *)
               (&this_02->tokenizer->state +
               (ulong)((this_02->tokenizer->type & ~tt_array_open) != tt_name) * 8);
      goto LAB_001df452;
    }
    goto LAB_001dfc3c;
  case tt_eof:
    local_198 = (undefined1  [8])pcVar26;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"parse error while reading object","");
    qVar17 = InputSource::getLastOffset(this_02->input);
    warn(this_02,qVar17,(string *)local_198);
    _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_02;
    if (local_198 != (undefined1  [8])pcVar26) {
      operator_delete((void *)local_198,(ulong)(local_190._8_8_ + 1));
      _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_03;
    }
    if ((char)local_124 == '\0') {
      local_198 = (undefined1  [8])pcVar26;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"unexpected EOF","");
      qVar17 = InputSource::getLastOffset(this_02->input);
      warn(this_02,qVar17,(string *)local_198);
      goto LAB_001dfc26;
    }
    local_158->input = (InputSource *)0x0;
    local_158->object_description = (string *)0x0;
    goto LAB_001dfc85;
  default:
    local_198 = (undefined1  [8])pcVar26;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"treating unknown token type as null while reading object","");
    qVar17 = InputSource::getLastOffset(this_02->input);
    warn(this_02,qVar17,(string *)local_198);
LAB_001df4c6:
    if (local_198 != (undefined1  [8])(local_190 + 8)) {
      operator_delete((void *)local_198,(ulong)(local_190._8_8_ + 1));
    }
switchD_001ded21_caseD_0:
    bVar14 = tooManyBadTokens(this_02);
    if (bVar14) goto LAB_001dfc3c;
switchD_001ded21_caseD_b:
    addNull(this_02);
    goto LAB_001debd9;
  }
  if ((string *)
      local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (string *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_01;
  }
  if (uVar27 < 2) goto LAB_001dfc85;
  goto LAB_001debd9;
code_r0x001df309:
  addScalar<QPDF_Operator,std::__cxx11::string_const&>
            (this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &(&pTVar5->val)[(tVar3 & ~tt_array_open) != tt_name]._M_dataplus);
  goto LAB_001debd9;
switchD_001ded21_caseD_2:
  if (499 < (ulong)(((long)(this_02->stack).
                           super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this_02->stack).
                           super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3)) {
    local_198 = (undefined1  [8])pcVar26;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"ignoring excessively deeply nested data structure","");
    qVar17 = InputSource::getLastOffset(this_02->input);
    warn(this_02,qVar17,(string *)local_198);
LAB_001dfc26:
    if (local_198 != (undefined1  [8])pcVar26) {
      operator_delete((void *)local_198,(ulong)(local_190._8_8_ + 1));
    }
LAB_001dfc3c:
    psVar24 = (string *)operator_new(0x70);
    psVar24->_M_string_length = 0x100000001;
    (psVar24->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_002eeae8;
    *(undefined1 *)&psVar24[2]._M_dataplus._M_p = 2;
    psVar24[2]._M_string_length = 0;
    psVar24[2].field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&psVar24[2].field_2 + 8) = 0;
    psVar24[3]._M_dataplus._M_p = (pointer)0x0;
    psVar24[3]._M_string_length = 0xffffffffffffffff;
    local_158->input = (InputSource *)&psVar24->field_2;
    local_158->object_description = psVar24;
    _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158;
LAB_001dfc85:
    QVar29.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var25._M_pi;
    QVar29.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_158;
    return (QPDFObjectHandle)
           QVar29.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
  }
  local_198._0_4_ = (uint)(tVar3 == tt_array_open) * 2;
  std::vector<QPDFParser::StackFrame,std::allocator<QPDFParser::StackFrame>>::
  emplace_back<InputSource&,QPDFParser::parser_state_e>
            (local_c8,this_02->input,(parser_state_e *)local_198);
  this_02->frame =
       (this_02->stack).
       super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>._M_impl.
       super__Vector_impl_data._M_finish + -1;
  goto LAB_001debd1;
}

Assistant:

QPDFObjectHandle
QPDFParser::parseRemainder(bool content_stream)
{
    // This method must take care not to resolve any objects. Don't check the type of any object
    // without first ensuring that it is a direct object. Otherwise, doing so may have the side
    // effect of reading the object and changing the file pointer. If you do this, it will cause a
    // logic error to be thrown from QPDF::inParse().

    bad_count = 0;
    bool b_contents = false;

    while (true) {
        if (!tokenizer.nextToken(input, object_description)) {
            warn(tokenizer.getErrorMessage());
        }
        ++good_count; // optimistically

        if (int_count != 0) {
            // Special handling of indirect references. Treat integer tokens as part of an indirect
            // reference until proven otherwise.
            if (tokenizer.getType() == QPDFTokenizer::tt_integer) {
                if (++int_count > 2) {
                    // Process the oldest buffered integer.
                    addInt(int_count);
                }
                last_offset_buffer[int_count % 2] = input.getLastOffset();
                int_buffer[int_count % 2] = QUtil::string_to_ll(tokenizer.getValue().c_str());
                continue;

            } else if (
                int_count >= 2 && tokenizer.getType() == QPDFTokenizer::tt_word &&
                tokenizer.getValue() == "R") {
                if (context == nullptr) {
                    QTC::TC("qpdf", "QPDFParser indirect without context");
                    throw std::logic_error(
                        "QPDFParser::parse called without context on an object "
                        "with indirect references");
                }
                auto id = QIntC::to_int(int_buffer[(int_count - 1) % 2]);
                auto gen = QIntC::to_int(int_buffer[(int_count) % 2]);
                if (!(id < 1 || gen < 0 || gen >= 65535)) {
                    add(QPDF::ParseGuard::getObject(context, id, gen, parse_pdf));
                } else {
                    QTC::TC("qpdf", "QPDFParser invalid objgen");
                    addNull();
                }
                int_count = 0;
                continue;

            } else if (int_count > 0) {
                // Process the buffered integers before processing the current token.
                if (int_count > 1) {
                    addInt(int_count - 1);
                }
                addInt(int_count);
                int_count = 0;
            }
        }

        switch (tokenizer.getType()) {
        case QPDFTokenizer::tt_eof:
            warn("parse error while reading object");
            if (content_stream) {
                // In content stream mode, leave object uninitialized to indicate EOF
                return {};
            }
            QTC::TC("qpdf", "QPDFParser eof in parseRemainder");
            warn("unexpected EOF");
            return {QPDFObject::create<QPDF_Null>()};

        case QPDFTokenizer::tt_bad:
            QTC::TC("qpdf", "QPDFParser bad token in parseRemainder");
            if (tooManyBadTokens()) {
                return {QPDFObject::create<QPDF_Null>()};
            }
            addNull();
            continue;

        case QPDFTokenizer::tt_brace_open:
        case QPDFTokenizer::tt_brace_close:
            QTC::TC("qpdf", "QPDFParser bad brace in parseRemainder");
            warn("treating unexpected brace token as null");
            if (tooManyBadTokens()) {
                return {QPDFObject::create<QPDF_Null>()};
            }
            addNull();
            continue;

        case QPDFTokenizer::tt_array_close:
            if (bad_count && !max_bad_count) {
                // Trigger warning.
                (void)tooManyBadTokens();
                return {QPDFObject::create<QPDF_Null>()};
            }
            if (frame->state == st_array) {
                auto object = frame->null_count > 100
                    ? QPDFObject::create<QPDF_Array>(std::move(frame->olist), true)
                    : QPDFObject::create<QPDF_Array>(std::move(frame->olist));
                setDescription(object, frame->offset - 1);
                // The `offset` points to the next of "[".  Set the rewind offset to point to the
                // beginning of "[". This has been explicitly tested with whitespace surrounding the
                // array start delimiter. getLastOffset points to the array end token and therefore
                // can't be used here.
                if (stack.size() <= 1) {
                    return object;
                }
                stack.pop_back();
                frame = &stack.back();
                add(std::move(object));
            } else {
                QTC::TC("qpdf", "QPDFParser bad array close in parseRemainder");
                warn("treating unexpected array close token as null");
                if (tooManyBadTokens()) {
                    return {QPDFObject::create<QPDF_Null>()};
                }
                addNull();
            }
            continue;

        case QPDFTokenizer::tt_dict_close:
            if (bad_count && !max_bad_count) {
                // Trigger warning.
                (void)tooManyBadTokens();
                return {QPDFObject::create<QPDF_Null>()};
            }
            if (frame->state <= st_dictionary_value) {
                // Attempt to recover more or less gracefully from invalid dictionaries.
                auto& dict = frame->dict;

                if (frame->state == st_dictionary_value) {
                    QTC::TC("qpdf", "QPDFParser no val for last key");
                    warn(
                        frame->offset,
                        "dictionary ended prematurely; using null as value for last key");
                    dict[frame->key] = QPDFObject::create<QPDF_Null>();
                }

                if (!frame->olist.empty()) {
                    fixMissingKeys();
                }

                if (!frame->contents_string.empty() && dict.count("/Type") &&
                    dict["/Type"].isNameAndEquals("/Sig") && dict.count("/ByteRange") &&
                    dict.count("/Contents") && dict["/Contents"].isString()) {
                    dict["/Contents"] = QPDFObjectHandle::newString(frame->contents_string);
                    dict["/Contents"].setParsedOffset(frame->contents_offset);
                }
                auto object = QPDFObject::create<QPDF_Dictionary>(std::move(dict));
                setDescription(object, frame->offset - 2);
                // The `offset` points to the next of "<<". Set the rewind offset to point to the
                // beginning of "<<". This has been explicitly tested with whitespace surrounding
                // the dictionary start delimiter. getLastOffset points to the dictionary end token
                // and therefore can't be used here.
                if (stack.size() <= 1) {
                    return object;
                }
                stack.pop_back();
                frame = &stack.back();
                add(std::move(object));
            } else {
                QTC::TC("qpdf", "QPDFParser bad dictionary close in parseRemainder");
                warn("unexpected dictionary close token");
                if (tooManyBadTokens()) {
                    return {QPDFObject::create<QPDF_Null>()};
                }
                addNull();
            }
            continue;

        case QPDFTokenizer::tt_array_open:
        case QPDFTokenizer::tt_dict_open:
            if (stack.size() > 499) {
                QTC::TC("qpdf", "QPDFParser too deep");
                warn("ignoring excessively deeply nested data structure");
                return {QPDFObject::create<QPDF_Null>()};
            } else {
                b_contents = false;
                stack.emplace_back(
                    input,
                    (tokenizer.getType() == QPDFTokenizer::tt_array_open) ? st_array
                                                                          : st_dictionary_key);
                frame = &stack.back();
                continue;
            }

        case QPDFTokenizer::tt_bool:
            addScalar<QPDF_Bool>(tokenizer.getValue() == "true");
            continue;

        case QPDFTokenizer::tt_null:
            addNull();
            continue;

        case QPDFTokenizer::tt_integer:
            if (!content_stream) {
                // Buffer token in case it is part of an indirect reference.
                last_offset_buffer[1] = input.getLastOffset();
                int_buffer[1] = QUtil::string_to_ll(tokenizer.getValue().c_str());
                int_count = 1;
            } else {
                addScalar<QPDF_Integer>(QUtil::string_to_ll(tokenizer.getValue().c_str()));
            }
            continue;

        case QPDFTokenizer::tt_real:
            addScalar<QPDF_Real>(tokenizer.getValue());
            continue;

        case QPDFTokenizer::tt_name:
            if (frame->state == st_dictionary_key) {
                frame->key = tokenizer.getValue();
                frame->state = st_dictionary_value;
                b_contents = decrypter && frame->key == "/Contents";
                continue;
            } else {
                addScalar<QPDF_Name>(tokenizer.getValue());
            }
            continue;

        case QPDFTokenizer::tt_word:
            if (content_stream) {
                addScalar<QPDF_Operator>(tokenizer.getValue());
            } else {
                QTC::TC("qpdf", "QPDFParser treat word as string in parseRemainder");
                warn("unknown token while reading object; treating as string");
                if (tooManyBadTokens()) {
                    return {QPDFObject::create<QPDF_Null>()};
                }
                addScalar<QPDF_String>(tokenizer.getValue());
            }
            continue;

        case QPDFTokenizer::tt_string:
            {
                auto const& val = tokenizer.getValue();
                if (decrypter) {
                    if (b_contents) {
                        frame->contents_string = val;
                        frame->contents_offset = input.getLastOffset();
                        b_contents = false;
                    }
                    std::string s{val};
                    decrypter->decryptString(s);
                    addScalar<QPDF_String>(s);
                } else {
                    addScalar<QPDF_String>(val);
                }
            }
            continue;

        default:
            warn("treating unknown token type as null while reading object");
            if (tooManyBadTokens()) {
                return {QPDFObject::create<QPDF_Null>()};
            }
            addNull();
        }
    }
}